

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O2

ptr<cmd_result<ptr<buffer>_>_> __thiscall
nuraft::raft_server::append_entries_ext
          (raft_server *this,
          vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
          *logs,req_ext_params *ext_params)

{
  pointer psVar1;
  ptr<buffer> *ppVar2;
  int iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *__args_2;
  ptr<cmd_result<ptr<buffer>_>_> pVar4;
  ptr<buffer> result;
  ptr<req_msg> req;
  undefined1 local_58 [16];
  int local_48 [2];
  ptr<log_entry> log;
  
  if (*(long *)((long)&(ext_params->after_precommit_).super__Function_base._M_functor + 8) ==
      *(long *)&(ext_params->after_precommit_).super__Function_base._M_functor) {
    result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    psVar1 = logs[0x21].
             super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (psVar1 != (pointer)0x0) {
      iVar3 = (**(code **)((psVar1->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + 0x38))();
      if (3 < iVar3) {
        psVar1 = logs[0x21].
                 super__Vector_base<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        msg_if_given_abi_cxx11_((string *)&req,"return null as log size is zero\n");
        (**(code **)((psVar1->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    + 0x40))
                  (psVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                   ,"append_entries_ext",0x5d,&req);
        std::__cxx11::string::~string((string *)&req);
      }
    }
    std::
    make_shared<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,std::shared_ptr<nuraft::buffer>&>
              ((shared_ptr<nuraft::buffer> *)this);
    ppVar2 = &result;
  }
  else {
    result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48[1] = 5;
    local_48[0] = 0;
    local_58._12_4_ = 0;
    log.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58._0_8_ = (element_type *)0x0;
    std::
    make_shared<nuraft::req_msg,unsigned_long,nuraft::msg_type,int,int,unsigned_long,unsigned_long,unsigned_long>
              ((unsigned_long *)&req,(msg_type *)&result,local_48 + 1,local_48,
               (unsigned_long *)(local_58 + 0xc),(unsigned_long *)&log,(unsigned_long *)local_58);
    for (__args_2 = *(__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> **)
                     &(ext_params->after_precommit_).super__Function_base._M_functor;
        __args_2 !=
        *(__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> **)
         ((long)&(ext_params->after_precommit_).super__Function_base._M_functor + 8);
        __args_2 = __args_2 + 1) {
      std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,__args_2);
      buffer::pos(result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
      local_58._0_8_ = local_58._0_8_ & 0xffffffff00000000;
      std::
      make_shared<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>const&,nuraft::log_val_type>
                ((int *)&log,(shared_ptr<nuraft::buffer> *)local_58,(log_val_type *)__args_2);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::push_back(&(req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   log_entries_,&log);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&log.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&result.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    send_msg_to_leader(this,(ptr<req_msg> *)logs,(req_ext_params *)&req);
    ppVar2 = (ptr<buffer> *)&req;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&((__shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2> *)
              &ppVar2->super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>)->_M_refcount)
  ;
  pVar4.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  pVar4.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<cmd_result<ptr<buffer>_>_>)
         pVar4.
         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< cmd_result< ptr<buffer> > > raft_server::append_entries_ext
                                 ( const std::vector< ptr<buffer> >& logs,
                                   const req_ext_params& ext_params )
{
    if (logs.size() == 0) {
        ptr<buffer> result(nullptr);
        p_in("return null as log size is zero\n");
        return cs_new< cmd_result< ptr<buffer> > >(result);
    }

    ptr<req_msg> req = cs_new<req_msg>
                       ( (ulong)0, msg_type::client_request, 0, 0,
                         (ulong)0, (ulong)0, (ulong)0 ) ;
    for (auto it = logs.begin(); it != logs.end(); ++it) {
        ptr<buffer> buf = *it;
        // Just in case when user forgot to reset the position.
        buf->pos(0);
        ptr<log_entry> log( cs_new<log_entry>
                            ( 0, *it, log_val_type::app_log ) );
        req->log_entries().push_back(log);
    }

    return send_msg_to_leader(req, ext_params);
}